

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_list(Curl_easy *data)

{
  IMAP *pIVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1->custom == (char *)0x0) {
    if (pIVar1->mailbox == (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)("");
    }
    else {
      pcVar3 = imap_atom(pIVar1->mailbox,true);
    }
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = imap_sendf(data,"LIST \"%s\" *",pcVar3);
    (*Curl_cfree)(pcVar3);
  }
  else {
    pcVar3 = "";
    if (pIVar1->custom_params != (char *)0x0) {
      pcVar3 = pIVar1->custom_params;
    }
    CVar2 = imap_sendf(data,"%s%s",pIVar1->custom,pcVar3);
  }
  if (CVar2 == CURLE_OK) {
    (data->conn->proto).imapc.state = IMAP_LIST;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_list(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;

  if(imap->custom)
    /* Send the custom request */
    result = imap_sendf(data, "%s%s", imap->custom,
                        imap->custom_params ? imap->custom_params : "");
  else {
    /* Make sure the mailbox is in the correct atom format if necessary */
    char *mailbox = imap->mailbox ? imap_atom(imap->mailbox, TRUE)
                                  : strdup("");
    if(!mailbox)
      return CURLE_OUT_OF_MEMORY;

    /* Send the LIST command */
    result = imap_sendf(data, "LIST \"%s\" *", mailbox);

    free(mailbox);
  }

  if(!result)
    imap_state(data, IMAP_LIST);

  return result;
}